

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

void __thiscall SPSUnit::insertHrdParameters(SPSUnit *this)

{
  pointer pHVar1;
  long lVar2;
  long lVar3;
  HRDParams *pHVar4;
  pointer pHVar5;
  int iVar6;
  int bitPos;
  long lVar7;
  HRDParams *pHVar8;
  HRDParams *pHVar9;
  int iVar10;
  bool addVuiHeader;
  
  pHVar5 = (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar3 = ((long)(this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pHVar5) / 0x60;
  do {
    pHVar1 = (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar2 = lVar3 * 0x60;
    do {
      lVar7 = lVar2;
      lVar3 = lVar3 + -1;
      if (lVar3 == -1) {
        pHVar4 = &this->nalHrdParams;
        if ((this->nalHrdParams).isPresent == false) {
          iVar6 = (this->nalHrdParams).bitLen;
          iVar10 = (this->vclHrdParams).bitLen;
          pHVar8 = &this->vclHrdParams;
          pHVar9 = pHVar4;
          if ((this->vclHrdParams).isPresent == false) goto LAB_001cc242;
        }
        else {
          if ((this->vclHrdParams).isPresent != false) goto LAB_001cc27f;
          iVar6 = (this->nalHrdParams).bitLen;
          iVar10 = (this->vclHrdParams).bitLen;
LAB_001cc242:
          pHVar8 = pHVar4;
          pHVar9 = &this->vclHrdParams;
        }
        HRDParams::operator=(pHVar9,pHVar8);
        bitPos = this->hrdParamsBitPos;
        addVuiHeader = bitPos == -1;
        if (addVuiHeader) {
          bitPos = this->vui_parameters_bit_pos;
          iVar6 = 0;
          iVar10 = 0;
        }
        insertHrdData(this,bitPos,iVar6,iVar10,addVuiHeader,pHVar4);
        (this->vclHrdParams).isPresent = true;
LAB_001cc27f:
        (this->nalHrdParams).isPresent = true;
        (this->vclHrdParams).isPresent = true;
        if (this->fixed_frame_rate_flag == 0) {
          updateTimingInfo(this);
          return;
        }
        return;
      }
      if ((&pHVar5[-1].isPresent)[lVar7] != true) {
        iVar6 = *(int *)((long)pHVar5 + lVar7 + -0x5c);
        pHVar4 = (HRDParams *)(&pHVar1[-1].isPresent + lVar7);
        iVar10 = *(int *)((long)pHVar1 + lVar7 + -0x5c);
        if (pHVar4->isPresent == false) goto LAB_001cc197;
        pHVar9 = (HRDParams *)(&pHVar5[-1].isPresent + lVar7);
        pHVar8 = pHVar4;
        goto LAB_001cc1a2;
      }
      lVar2 = lVar7 + -0x60;
    } while ((&pHVar1[-1].isPresent)[lVar7] != false);
    iVar6 = *(int *)((long)&pHVar5[-1].bitLen + lVar7);
    pHVar4 = (HRDParams *)(&pHVar1[-1].isPresent + lVar7);
    iVar10 = *(int *)((long)&pHVar1[-1].bitLen + lVar7);
LAB_001cc197:
    pHVar8 = (HRDParams *)(&pHVar5[-1].isPresent + lVar7);
    pHVar9 = pHVar4;
LAB_001cc1a2:
    HRDParams::operator=(pHVar9,pHVar8);
    insertHrdData(this,(this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar3],iVar6,iVar10,false,
                  (HRDParams *)
                  (&(this->mvcNalHrdParams).
                    super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
                    super__Vector_impl_data._M_start[-1].isPresent + lVar7));
    pHVar5 = (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (&pHVar5[-1].isPresent)[lVar7] = true;
    (&(this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
      super__Vector_impl_data._M_start[-1].isPresent)[lVar7] = true;
  } while( true );
}

Assistant:

void SPSUnit::insertHrdParameters()
{
    for (size_t i = mvcNalHrdParams.size(); i-- > 0;)
    {
        if (!mvcNalHrdParams[i].isPresent || !mvcVclHrdParams[i].isPresent)
        {
            const int nalBitLen = mvcNalHrdParams[i].bitLen;
            const int vclBitLen = mvcVclHrdParams[i].bitLen;

            if (mvcNalHrdParams[i].isPresent || !mvcVclHrdParams[i].isPresent)
                mvcVclHrdParams[i] = mvcNalHrdParams[i];
            else if (!mvcNalHrdParams[i].isPresent || mvcVclHrdParams[i].isPresent)
                mvcNalHrdParams[i] = mvcVclHrdParams[i];
            else
            {
                mvcNalHrdParams[i].resetDefault(true);
                mvcVclHrdParams[i].resetDefault(true);
            }

            insertHrdData(mvcHrdParamsBitPos[i], nalBitLen, vclBitLen, false, mvcNalHrdParams[i]);
            mvcNalHrdParams[i].isPresent = true;
            mvcVclHrdParams[i].isPresent = true;
        }
    }

    if (!nalHrdParams.isPresent || !vclHrdParams.isPresent)
    {
        const int nalBitLen = nalHrdParams.bitLen;
        const int vclBitLen = vclHrdParams.bitLen;

        if (nalHrdParams.isPresent || !vclHrdParams.isPresent)
            vclHrdParams = nalHrdParams;
        else if (!nalHrdParams.isPresent || vclHrdParams.isPresent)
            nalHrdParams = vclHrdParams;
        else
        {
            nalHrdParams.resetDefault(false);
            vclHrdParams.resetDefault(false);
        }

        if (hrdParamsBitPos != -1)
            insertHrdData(hrdParamsBitPos, nalBitLen, vclBitLen, false, nalHrdParams);
        else
            insertHrdData(vui_parameters_bit_pos, 0, 0, true, nalHrdParams);
        nalHrdParams.isPresent = true;
        vclHrdParams.isPresent = true;
    }
    nalHrdParams.isPresent = true;
    vclHrdParams.isPresent = true;

    if (!fixed_frame_rate_flag)
        updateTimingInfo();
}